

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QTuioCursor * __thiscall
QMap<int,_QTuioCursor>::value
          (QTuioCursor *__return_storage_ptr__,QMap<int,_QTuioCursor> *this,int *key,
          QTuioCursor *defaultValue)

{
  QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
  *pQVar1;
  float fVar2;
  float fVar3;
  State SVar4;
  undefined3 uVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  const_iterator cVar10;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
                 *)0x0) {
    cVar10 = std::
             _Rb_tree<int,_std::pair<const_int,_QTuioCursor>,_std::_Select1st<std::pair<const_int,_QTuioCursor>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>
             ::find(&(pQVar1->m)._M_t,key);
    if ((_Rb_tree_header *)cVar10._M_node !=
        &(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      defaultValue = (QTuioCursor *)&cVar10._M_node[1].field_0x4;
    }
  }
  iVar6 = defaultValue->m_id;
  fVar7 = defaultValue->m_x;
  fVar8 = defaultValue->m_y;
  fVar9 = defaultValue->m_vx;
  fVar2 = defaultValue->m_vy;
  fVar3 = defaultValue->m_acceleration;
  SVar4 = defaultValue->m_state;
  uVar5 = *(undefined3 *)&defaultValue->field_0x19;
  __return_storage_ptr__->m_vx = defaultValue->m_vx;
  __return_storage_ptr__->m_vy = fVar2;
  __return_storage_ptr__->m_acceleration = fVar3;
  __return_storage_ptr__->m_state = SVar4;
  *(undefined3 *)&__return_storage_ptr__->field_0x19 = uVar5;
  __return_storage_ptr__->m_id = iVar6;
  __return_storage_ptr__->m_x = fVar7;
  __return_storage_ptr__->m_y = fVar8;
  __return_storage_ptr__->m_vx = fVar9;
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }